

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_arith_decode_advance_log2(stb_arith *a,uint totalfreq2,uint freq,uint cumfreq)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = a->range >> ((byte)totalfreq2 & 0x1f);
  a->code = a->code - cumfreq * uVar2;
  uVar2 = uVar2 * freq;
  a->range = uVar2;
  while (uVar2 < 0x1000000) {
    iVar1 = (*a->output->getbyte)(a->output);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    uVar2 = a->range;
    a->code = a->code * 0x100 + iVar1;
  }
  return;
}

Assistant:

void stb_arith_decode_advance_log2(stb_arith *a, unsigned int totalfreq2, unsigned int freq, unsigned int cumfreq)
{
   unsigned int freqsize = a->range >> totalfreq2;
   a->code -= freqsize * cumfreq;
   a->range = freqsize * freq;
   while (a->range < 0x1000000)
      stb__renorm_decoder(a);
}